

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::Error::Error(Error *this,string *name,string *msg,ExitCodes exit_code)

{
  string local_68;
  string local_48;
  ExitCodes local_24;
  string *psStack_20;
  ExitCodes exit_code_local;
  string *msg_local;
  string *name_local;
  Error *this_local;
  
  local_24 = exit_code;
  psStack_20 = msg;
  msg_local = name;
  name_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)name);
  ::std::__cxx11::string::string((string *)&local_68,(string *)msg);
  Error(this,&local_48,&local_68,local_24);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

Error(std::string name, std::string msg, ExitCodes exit_code) : Error(name, msg, static_cast<int>(exit_code)) {}